

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-sampling.cpp
# Opt level: O0

void test_min_p(vector<float,_std::allocator<float>_> *probs,
               vector<float,_std::allocator<float>_> *probs_expected,float p)

{
  sampler_tester *this;
  llama_sampler *sampler;
  sampler_tester *in_RSI;
  undefined4 in_XMM0_Da;
  sampler_tester tester;
  llama_sampler *in_stack_ffffffffffffff78;
  llama_token_data_array *in_stack_ffffffffffffff80;
  sampler_tester *in_stack_ffffffffffffff90;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  
  sampler_tester::sampler_tester
            (in_RSI,(vector<float,_std::allocator<float>_> *)
                    CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe0);
  printf("%s:%d (%s)\n",
         "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-sampling.cpp"
         ,0x6f,"test_min_p");
  dump(in_stack_ffffffffffffff80);
  printf("-\n");
  this = (sampler_tester *)llama_sampler_init_min_p(in_XMM0_Da,1);
  sampler_tester::apply(this,in_stack_ffffffffffffff78);
  sampler = (llama_sampler *)llama_sampler_init_dist(0);
  sampler_tester::apply(this,sampler);
  printf("%s:%d (%s)\n",
         "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-sampling.cpp"
         ,0x72,"test_min_p");
  dump(&this->cur_p);
  printf("-\n");
  sampler_tester::check(in_stack_ffffffffffffff90);
  sampler_tester::~sampler_tester(this);
  return;
}

Assistant:

static void test_min_p(const std::vector<float> & probs, const std::vector<float> & probs_expected, float p) {
    sampler_tester tester(probs, probs_expected);

    DUMP(&tester.cur_p);
    tester.apply(llama_sampler_init_min_p(p, 1));
    tester.apply(llama_sampler_init_dist (0));
    DUMP(&tester.cur_p);

    tester.check();
}